

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool QAnyStringView::equal(QAnyStringView lhs,QAnyStringView rhs)

{
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  anon_class_16_1_ba1d745d *in_RSI;
  long in_FS_OFFSET;
  bool local_39;
  QAnyStringView local_28;
  QAnyStringView *this;
  
  this = *(QAnyStringView **)(in_FS_OFFSET + 0x28);
  qVar3 = size((QAnyStringView *)&stack0xffffffffffffffe8);
  qVar4 = size(&local_28);
  if (qVar3 != qVar4) {
    bVar1 = isUtf8((QAnyStringView *)0x506a5a);
    bVar2 = isUtf8((QAnyStringView *)0x506a6d);
    if (bVar1 == bVar2) {
      local_39 = false;
      goto LAB_00506aad;
    }
  }
  local_39 = visit<QAnyStringView::equal(QAnyStringView,QAnyStringView)::__0>(this,in_RSI);
LAB_00506aad:
  if (*(QAnyStringView **)(in_FS_OFFSET + 0x28) == this) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QAnyStringView::equal(QAnyStringView lhs, QAnyStringView rhs) noexcept
{
    if (lhs.size() != rhs.size() && lhs.isUtf8() == rhs.isUtf8())
        return false;
    return lhs.visit([rhs](auto lhs) {
        return rhs.visit([lhs](auto rhs) {
            return QtPrivate::equalStrings(lhs, rhs);
        });
    });
}